

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

OptionBase<Inferences::ALASCA::BinaryResolutionConf::Lhs> * __thiscall
Lib::OptionBase<Inferences::ALASCA::BinaryResolutionConf::Lhs>::operator=
          (OptionBase<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this,
          OptionBase<Inferences::ALASCA::BinaryResolutionConf::Lhs> *other)

{
  bool bVar1;
  SelectedLiteral local_50;
  
  bVar1 = other->_isSome;
  if (bVar1 == true) {
    Kernel::SelectedLiteral::SelectedLiteral(&local_50,(SelectedLiteral *)&other->_elem);
    Kernel::SelectedLiteral::SelectedLiteral((SelectedLiteral *)&this->_elem,&local_50);
    bVar1 = other->_isSome;
  }
  this->_isSome = bVar1;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }